

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<unsigned_short>>,std::tuple<unsigned_short,unsigned_short>>
               (tuple<testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>_> *matchers
               ,tuple<unsigned_short,_unsigned_short> *values,ostream *os)

{
  MatcherInterface<const_unsigned_short_&> *pMVar1;
  int iVar2;
  ostream *poVar3;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_> *ptr;
  type matcher;
  StringMatchResultListener listener;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  undefined **local_1e0;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_> local_1d8;
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<unsigned_short>>,std::tuple<unsigned_short,unsigned_short>>
            (matchers,values,os);
  local_1e0 = &PTR__MatcherBase_001acdc8;
  ptr = &(matchers->
         super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>_>
         ).super__Tuple_impl<1UL,_testing::Matcher<unsigned_short>_>.
         super__Head_base<1UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
         super_MatcherBase<unsigned_short>.impl_;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::linked_ptr(&local_1d8,ptr);
  local_1e0 = &PTR__MatcherBase_001acd80;
  local_1c0 = local_1a8;
  local_1c8 = &PTR__StringMatchResultListener_001acde8;
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar2 = (*((local_1d8.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4]
          )(local_1d8.value_,values,&local_1c8);
  if ((char)iVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    pMVar1 = ptr->value_;
    (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar1,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__cxx11::stringbuf::str();
    iVar2 = std::__cxx11::string::compare((char *)&local_200);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_200,local_1f8);
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_001acde8;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  local_1e0 = &PTR__MatcherBase_001acdc8;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::~linked_ptr(&local_1d8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    GTEST_REFERENCE_TO_CONST_(Value) value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // FIXME: include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }